

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_52dd::TlbExportVisitor::visit_(TlbExportVisitor *this,Pointer *type)

{
  ostream *poVar1;
  Type *type_00;
  string sStack_48;
  
  std::operator<<(this->m_stream,"<pointer ");
  indirect(this->m_stream,(Indirect *)type);
  poVar1 = std::operator<<(this->m_stream," ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(&sStack_48,this);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(&sStack_48,type,type_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</pointer>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Pointer const& type)
    {
        m_stream << "<pointer ";
        indirect(m_stream, type);
        m_stream << " " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</pointer>";
        return true;
    }